

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

Time __thiscall helics::TimeCoordinator::generateAllowedTime(TimeCoordinator *this,Time testTime)

{
  TimeRepresentation<count_time<9,_long>_> t2;
  long lVar1;
  baseType bVar2;
  Time TVar3;
  long lVar4;
  double dVar5;
  
  t2.internalTimeCode = (this->info).period.internalTimeCode;
  TVar3.internalTimeCode = testTime.internalTimeCode;
  if ((1 < t2.internalTimeCode) &&
     (TVar3.internalTimeCode = 0x7fffffffffffffff, testTime.internalTimeCode != 0x7fffffffffffffff))
  {
    lVar4 = (this->time_grantBase).internalTimeCode;
    TVar3.internalTimeCode = (this->info).offset.internalTimeCode;
    if ((TVar3.internalTimeCode <= lVar4) ||
       (lVar4 = TVar3.internalTimeCode, TVar3.internalTimeCode < testTime.internalTimeCode)) {
      if (t2.internalTimeCode < testTime.internalTimeCode - lVar4) {
        dVar5 = operator/((TimeRepresentation<count_time<9,_long>_>)
                          (testTime.internalTimeCode - lVar4),t2);
        dVar5 = ceil(dVar5);
        lVar1 = (this->info).period.internalTimeCode;
        bVar2 = count_time<9,_long>::convert
                          (dVar5 * ((double)(lVar1 % 1000000000) * 1e-09 +
                                   (double)(lVar1 / 1000000000)));
        TVar3.internalTimeCode = bVar2 + lVar4;
      }
      else {
        TVar3.internalTimeCode = lVar4 + t2.internalTimeCode;
      }
    }
    return (Time)TVar3.internalTimeCode;
  }
  return (Time)TVar3.internalTimeCode;
}

Assistant:

Time TimeCoordinator::generateAllowedTime(Time testTime) const
{
    if (info.period > timeEpsilon) {
        if (testTime == Time::maxVal()) {
            return testTime;
        }
        auto timeBase = time_grantBase;
        if (time_grantBase < info.offset) {
            timeBase = info.offset;
            if (testTime <= info.offset) {
                return info.offset;
            }
        }
        if (testTime - timeBase > info.period) {
            auto blk = std::ceil((testTime - timeBase) / info.period);
            testTime = timeBase + blk * info.period;
        } else {
            testTime = timeBase + info.period;
        }
    }
    return testTime;
}